

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILoader.cpp
# Opt level: O2

void UI::LoaderLoadButton(shared_ptr<LoaderThread> *loader_thread,char **open_modal)

{
  bool bVar1;
  
  bVar1 = ImGui::MenuItem(anon_var_dwarf_1ecbc1,(char *)0x0,false,true);
  if (bVar1) {
    *open_modal = "Load Scene";
  }
  bVar1 = ImGui::IsItemHovered(0);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::TextUnformatted("Load Scene",(char *)0x0);
    ImGui::EndTooltip();
    return;
  }
  return;
}

Assistant:

void LoaderLoadButton(const std::shared_ptr<LoaderThread> &loader_thread, const char **open_modal) {
	if (ImGui::MenuItem(ICON_FA_FOLDER_OPEN)) {
		*open_modal = kLoaderLoadSceneModal;
	}
	if (ImGui::IsItemHovered()) {
		ImGui::BeginTooltip();
		ImGui::TextUnformatted("Load Scene");
		ImGui::EndTooltip();
	}
}